

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_image * nk_image_handle(nk_handle handle)

{
  nk_handle in_RSI;
  nk_image *in_RDI;
  nk_image *s;
  nk_image *pnVar1;
  
  pnVar1 = in_RDI;
  nk_zero(in_RDI,(nk_size)in_RDI);
  in_RDI->handle = in_RSI;
  in_RDI->w = 0;
  in_RDI->h = 0;
  in_RDI->region[0] = 0;
  in_RDI->region[1] = 0;
  in_RDI->region[2] = 0;
  in_RDI->region[3] = 0;
  return pnVar1;
}

Assistant:

NK_API struct nk_image
nk_image_handle(nk_handle handle)
{
struct nk_image s;
nk_zero(&s, sizeof(s));
s.handle = handle;
s.w = 0; s.h = 0;
s.region[0] = 0;
s.region[1] = 0;
s.region[2] = 0;
s.region[3] = 0;
return s;
}